

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
Attribute_Access<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_Returned_Converted_Config>
::do_call(Attribute_Access<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_Returned_Converted_Config>
          *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  Returned_Converted_Config *pRVar1;
  Boxed_Value *in_RCX;
  Boxed_Value BVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)((this_00->m_mutex)._M_impl._M_rwlock.__align + 0x10) & 1) == 0) {
    pRVar1 = boxed_cast<Returned_Converted_Config*>((chaiscript *)this_00,in_RCX,t_conversions);
    BVar3 = detail::
            Handle_Return<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&>
            ::handle((Handle_Return<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&>
                      *)this,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)((long)&pRVar1->num_iterations + (long)params[4].m_begin));
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    pRVar1 = boxed_cast<Returned_Converted_Config_const*>
                       ((chaiscript *)this_00,in_RCX,t_conversions);
    BVar3 = detail::
            Handle_Return<const_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&>
            ::handle((Handle_Return<const_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&>
                      *)this,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)((long)&pRVar1->num_iterations + (long)params[4].m_begin));
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }